

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O3

idx_t __thiscall duckdb::LocalFileSystem::GetFilePointer(LocalFileSystem *this,FileHandle *handle)

{
  pointer pcVar1;
  idx_t iVar2;
  IOException *this_00;
  int *piVar3;
  char *params_1;
  undefined1 local_10b;
  undefined1 local_10a;
  undefined1 local_109;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  
  iVar2 = lseek(*(int *)&handle[1]._vptr_FileHandle,0,1);
  if (iVar2 != 0xffffffffffffffff) {
    return iVar2;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"Could not get file position file \"%s\": %s","");
  piVar3 = __errno_location();
  std::__cxx11::to_string(&local_c8,*piVar3);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_a8,(char (*) [6])"errno",&local_c8);
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_68,&local_a8,&local_68,0,&local_109,&local_10a,&local_10b);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  pcVar1 = (handle->path)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar1,pcVar1 + (handle->path)._M_string_length);
  params_1 = strerror(*piVar3);
  IOException::IOException<std::__cxx11::string,char*>
            (this_00,&local_108,&local_68,&local_e8,params_1);
  __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t LocalFileSystem::GetFilePointer(FileHandle &handle) {
	int fd = handle.Cast<UnixFileHandle>().fd;
	off_t position = lseek(fd, 0, SEEK_CUR);
	if (position == (off_t)-1) {
		throw IOException("Could not get file position file \"%s\": %s", {{"errno", std::to_string(errno)}},
		                  handle.path, strerror(errno));
	}
	return UnsafeNumericCast<idx_t>(position);
}